

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest::Instantiate(InterpTest *this,RefVec *imports)

{
  bool bVar1;
  Trap *this_00;
  Message *message;
  char *message_00;
  Ptr *in_R9;
  string local_1e8;
  AssertHelper local_1c8;
  string local_1c0;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_;
  Ptr local_180;
  undefined1 local_168 [8];
  RefPtr<wabt::interp::Trap> trap;
  Ptr local_30;
  Ref local_18;
  RefVec *imports_local;
  InterpTest *this_local;
  
  local_18.index = (size_t)imports;
  imports_local = (RefVec *)this;
  wabt::interp::ModuleDesc::ModuleDesc((ModuleDesc *)&trap.root_index_,&this->module_desc_);
  wabt::interp::Module::New(&local_30,&this->store_,(ModuleDesc *)&trap.root_index_);
  wabt::interp::RefPtr<wabt::interp::Module>::operator=(&this->mod_,&local_30);
  wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr(&local_30);
  wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)&trap.root_index_);
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_168);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )wabt::interp::RefPtr<wabt::interp::Module>::ref(&this->mod_);
  wabt::interp::Instance::Instantiate
            (&local_180,(Instance *)&this->store_,
             (Store *)gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_18,(RefVec *)local_168,in_R9);
  wabt::interp::RefPtr<wabt::interp::Instance>::operator=(&this->inst_,&local_180);
  wabt::interp::RefPtr<wabt::interp::Instance>::~RefPtr(&local_180);
  testing::AssertionResult::AssertionResult<wabt::interp::RefPtr<wabt::interp::Instance>>
            ((AssertionResult *)local_198,&this->inst_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    this_00 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                        ((RefPtr<wabt::interp::Trap> *)local_168);
    wabt::interp::Trap::message_abi_cxx11_(&local_1c0,this_00);
    message = testing::Message::operator<<(&local_1a0,&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)local_198,(AssertionResult *)"inst_","false","true",
               (char *)in_R9);
    message_00 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x2b,message_00);
    testing::internal::AssertHelper::operator=(&local_1c8,message);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c0);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_168);
  return;
}

Assistant:

void Instantiate(const RefVec& imports = RefVec{}) {
    mod_ = Module::New(store_, module_desc_);
    RefPtr<Trap> trap;
    inst_ = Instance::Instantiate(store_, mod_.ref(), imports, &trap);
    ASSERT_TRUE(inst_) << trap->message();
  }